

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeUpdateMeta(Btree *p,int idx,u32 iMeta)

{
  int *piVar1;
  BtShared *pBVar2;
  MemPage *pMVar3;
  u8 *puVar4;
  int iVar5;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pMVar3 = pBVar2->pPage1;
  puVar4 = pMVar3->aData;
  iVar5 = sqlite3PagerWrite(pMVar3->pDbPage);
  if ((iVar5 == 0) &&
     (*(u32 *)(puVar4 + (long)idx * 4 + 0x24) =
           iMeta >> 0x18 | (iMeta & 0xff0000) >> 8 | (iMeta & 0xff00) << 8 | iMeta << 0x18, idx == 7
     )) {
    pBVar2->incrVacuum = (u8)iMeta;
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeUpdateMeta(Btree *p, int idx, u32 iMeta){
  BtShared *pBt = p->pBt;
  unsigned char *pP1;
  int rc;
  assert( idx>=1 && idx<=15 );
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1!=0 );
  pP1 = pBt->pPage1->aData;
  rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
  if( rc==SQLITE_OK ){
    put4byte(&pP1[36 + idx*4], iMeta);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( idx==BTREE_INCR_VACUUM ){
      assert( pBt->autoVacuum || iMeta==0 );
      assert( iMeta==0 || iMeta==1 );
      pBt->incrVacuum = (u8)iMeta;
    }
#endif
  }
  sqlite3BtreeLeave(p);
  return rc;
}